

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_call.cpp
# Opt level: O2

unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>,_true> __thiscall
duckdb::Transformer::TransformCall(Transformer *this,PGCallStmt *stmt)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  pointer pCVar3;
  long in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  optional_ptr<duckdb_libpgquery::PGFuncCall,_true> local_20;
  
  make_uniq<duckdb::CallStatement>();
  local_20.ptr = *(PGFuncCall **)(in_RDX + 8);
  optional_ptr<duckdb_libpgquery::PGFuncCall,_true>::operator*(&stack0xffffffffffffffe0);
  TransformFuncCall((Transformer *)&stack0xffffffffffffffd8,(PGFuncCall *)stmt);
  pCVar3 = unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>,_true>::
           operator->((unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>,_true>
                       *)this);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ParsedExpression *)0x0;
  _Var1._M_head_impl =
       (pCVar3->function).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pCVar3->function).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    if ((Transformer *)local_28._M_head_impl != (Transformer *)0x0) {
      (*(code *)((((Transformer *)local_28._M_head_impl)->parent).ptr)->options)();
    }
  }
  return (unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>_>)
         (unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>_>)this;
}

Assistant:

unique_ptr<CallStatement> Transformer::TransformCall(duckdb_libpgquery::PGCallStmt &stmt) {
	auto result = make_uniq<CallStatement>();
	result->function = TransformFuncCall(*PGPointerCast<duckdb_libpgquery::PGFuncCall>(stmt.func));
	return result;
}